

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

ssize_t amqp_try_send(amqp_connection_state_t state,void *buf,size_t len,amqp_time_t deadline,
                     int flags)

{
  ssize_t sVar1;
  uint64_t in_RDX;
  size_t in_RSI;
  undefined4 in_R8D;
  ssize_t len_left;
  void *buf_left;
  ssize_t res;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  amqp_time_t deadline_00;
  
  deadline_00.time_point_ns = in_RDX;
  while( true ) {
    while (in_stack_ffffffffffffffc8 =
                (void *)amqp_socket_send((amqp_socket_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0)
                                         ,in_stack_ffffffffffffffc8,in_RSI,(int)(in_RDX >> 0x20)),
          0 < (long)in_stack_ffffffffffffffc8) {
      in_RDX = in_RDX - (long)in_stack_ffffffffffffffc8;
      in_RSI = in_RSI + (long)in_stack_ffffffffffffffc8;
      if (in_RDX == 0) {
        return deadline_00.time_point_ns;
      }
    }
    sVar1 = do_poll((amqp_connection_state_t)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                    (ssize_t)in_stack_ffffffffffffffc8,deadline_00);
    if (sVar1 != 0) break;
    in_stack_ffffffffffffffc8 = (void *)0x0;
  }
  if (sVar1 != -0xd) {
    return sVar1;
  }
  return deadline_00.time_point_ns - in_RDX;
}

Assistant:

ssize_t amqp_try_send(amqp_connection_state_t state, const void *buf,
                      size_t len, amqp_time_t deadline, int flags) {
  ssize_t res;
  void *buf_left = (void *)buf;
  /* Assume that len is not going to be larger than ssize_t can hold. */
  ssize_t len_left = (size_t)len;

start_send:
  res = amqp_socket_send(state->socket, buf_left, len_left, flags);

  if (res > 0) {
    len_left -= res;
    buf_left = (char *)buf_left + res;
    if (0 == len_left) {
      return (ssize_t)len;
    }
    goto start_send;
  }
  res = do_poll(state, res, deadline);
  if (AMQP_STATUS_OK == res) {
    goto start_send;
  }
  if (AMQP_STATUS_TIMEOUT == res) {
    return (ssize_t)len - len_left;
  }
  return res;
}